

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_channel_id_hash(SSL_HANDSHAKE *hs,uint8_t *out,size_t *out_len)

{
  bool bVar1;
  uint16_t uVar2;
  uchar *puVar3;
  size_t sVar4;
  pointer psVar5;
  size_t local_110;
  size_t hs_hash_len;
  uint8_t hs_hash [64];
  undefined1 local_c0 [8];
  SHA256_CTX ctx;
  undefined1 local_40 [8];
  Array<unsigned_char> msg;
  SSL *ssl;
  size_t *out_len_local;
  uint8_t *out_local;
  SSL_HANDSHAKE *hs_local;
  
  msg.size_ = (size_t)hs->ssl;
  uVar2 = ssl_protocol_version((SSL *)msg.size_);
  if (uVar2 < 0x304) {
    SHA256_Init((SHA256_CTX *)local_c0);
    SHA256_Update((SHA256_CTX *)local_c0,"TLS Channel ID signature",0x19);
    bVar1 = std::operator!=((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                            (msg.size_ + 0x58),(nullptr_t)0x0);
    if (bVar1) {
      SHA256_Update((SHA256_CTX *)local_c0,"Resumption",0xb);
      psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(msg.size_ + 0x58))
      ;
      bVar1 = InplaceVector<unsigned_char,_64UL>::empty(&psVar5->original_handshake_hash);
      if (bVar1) {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x1254);
        return false;
      }
      psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(msg.size_ + 0x58))
      ;
      puVar3 = InplaceVector<unsigned_char,_64UL>::data(&psVar5->original_handshake_hash);
      psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(msg.size_ + 0x58))
      ;
      sVar4 = InplaceVector<unsigned_char,_64UL>::size(&psVar5->original_handshake_hash);
      SHA256_Update((SHA256_CTX *)local_c0,puVar3,sVar4);
    }
    bVar1 = SSLTranscript::GetHash(&hs->transcript,(uint8_t *)&hs_hash_len,&local_110);
    if (bVar1) {
      SHA256_Update((SHA256_CTX *)local_c0,&hs_hash_len,local_110);
      SHA256_Final(out,(SHA256_CTX *)local_c0);
      *out_len = 0x20;
      hs_local._7_1_ = true;
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  else {
    Array<unsigned_char>::Array((Array<unsigned_char> *)local_40);
    hs_local._7_1_ =
         tls13_get_cert_verify_signature_input
                   (hs,(Array<unsigned_char> *)local_40,ssl_cert_verify_channel_id);
    if (hs_local._7_1_) {
      puVar3 = Array<unsigned_char>::data((Array<unsigned_char> *)local_40);
      sVar4 = Array<unsigned_char>::size((Array<unsigned_char> *)local_40);
      SHA256(puVar3,sVar4,out);
      *out_len = 0x20;
    }
    ctx.num = 1;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_40);
  }
  return hs_local._7_1_;
}

Assistant:

bool tls1_channel_id_hash(SSL_HANDSHAKE *hs, uint8_t *out, size_t *out_len) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    Array<uint8_t> msg;
    if (!tls13_get_cert_verify_signature_input(hs, &msg,
                                               ssl_cert_verify_channel_id)) {
      return false;
    }
    SHA256(msg.data(), msg.size(), out);
    *out_len = SHA256_DIGEST_LENGTH;
    return true;
  }

  SHA256_CTX ctx;

  SHA256_Init(&ctx);
  static const char kClientIDMagic[] = "TLS Channel ID signature";
  SHA256_Update(&ctx, kClientIDMagic, sizeof(kClientIDMagic));

  if (ssl->session != NULL) {
    static const char kResumptionMagic[] = "Resumption";
    SHA256_Update(&ctx, kResumptionMagic, sizeof(kResumptionMagic));
    if (ssl->session->original_handshake_hash.empty()) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
    SHA256_Update(&ctx, ssl->session->original_handshake_hash.data(),
                  ssl->session->original_handshake_hash.size());
  }

  uint8_t hs_hash[EVP_MAX_MD_SIZE];
  size_t hs_hash_len;
  if (!hs->transcript.GetHash(hs_hash, &hs_hash_len)) {
    return false;
  }
  SHA256_Update(&ctx, hs_hash, (size_t)hs_hash_len);
  SHA256_Final(out, &ctx);
  *out_len = SHA256_DIGEST_LENGTH;
  return true;
}